

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::AddBlendParams(BlenderImporter *this,aiMaterial *result,Material *source)

{
  float mirrorGlossAnisotropic;
  int mirrorGlossSamples;
  float mirrorGlossThreshold;
  float mirrorGlossAmount;
  int mirrorFadeTo;
  float mirrorMaxDist;
  int mirrorDepth;
  float mirrorBlend;
  float mirrorFresnel;
  float mirrorReflectivity;
  int mirrorUse;
  int transparencyGlossSamples;
  float transparencyGlossThreshold;
  float transparencyGlossAmount;
  int transparencyDepth;
  float transparencyLimit;
  float transparencyFalloff;
  float transparencyFilter;
  float transparencyIor;
  float transparencyBlend;
  float transparencyFresnel;
  float transparencySpecular;
  float transparencyAlpha;
  int transparencyMethod;
  int transparencyUse;
  int specularHardness;
  int specularRamp;
  int specularShader;
  float specularIntensity;
  int diffuseRamp;
  int diffuseShader;
  float diffuseIntensity;
  aiColor3D mirrorColor;
  aiColor3D specularColor;
  aiColor3D diffuseColor;
  float local_cc;
  int local_c8;
  float local_c4;
  float local_c0;
  int local_bc;
  float local_b8;
  int local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  uint local_a4;
  int local_a0;
  float local_9c;
  float local_98;
  int local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  uint local_70;
  uint local_6c;
  int local_68 [3];
  float local_5c [2];
  int local_54;
  float local_50;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 local_34;
  float local_2c;
  
  local_34._0_4_ = source->r;
  local_34._4_4_ = source->g;
  local_2c = source->b;
  aiMaterial::AddBinaryProperty(result,&local_34,0xc,"$mat.blend.diffuse.color",0,0,aiPTI_Float);
  local_50 = source->ref;
  aiMaterial::AddBinaryProperty(result,&local_50,4,"$mat.blend.diffuse.intensity",0,0,aiPTI_Float);
  local_54 = (int)source->diff_shader;
  aiMaterial::AddBinaryProperty(result,&local_54,4,"$mat.blend.diffuse.shader",0,0,aiPTI_Integer);
  local_5c[1] = 0.0;
  aiMaterial::AddBinaryProperty(result,local_5c + 1,4,"$mat.blend.diffuse.ramp",0,0,aiPTI_Integer);
  local_40._0_4_ = source->specr;
  local_40._4_4_ = source->specg;
  local_38 = source->specb;
  aiMaterial::AddBinaryProperty(result,&local_40,0xc,"$mat.blend.specular.color",0,0,aiPTI_Float);
  local_5c[0] = source->spec;
  aiMaterial::AddBinaryProperty(result,local_5c,4,"$mat.blend.specular.intensity",0,0,aiPTI_Float);
  local_68[2] = (int)source->spec_shader;
  aiMaterial::AddBinaryProperty
            (result,local_68 + 2,4,"$mat.blend.specular.shader",0,0,aiPTI_Integer);
  local_68[1] = 0;
  aiMaterial::AddBinaryProperty(result,local_68 + 1,4,"$mat.blend.specular.ramp",0,0,aiPTI_Integer);
  local_68[0] = (int)source->har;
  aiMaterial::AddBinaryProperty(result,local_68,4,"$mat.blend.specular.hardness",0,0,aiPTI_Integer);
  local_6c = (uint)source->mode >> 0x10 & 1;
  aiMaterial::AddBinaryProperty(result,&local_6c,4,"$mat.blend.transparency.use",0,0,aiPTI_Integer);
  local_70 = 2;
  if (((uint)source->mode >> 0x11 & 1) == 0) {
    local_70 = (uint)source->mode >> 6 & 1;
  }
  aiMaterial::AddBinaryProperty
            (result,&local_70,4,"$mat.blend.transparency.method",0,0,aiPTI_Integer);
  local_74 = source->alpha;
  aiMaterial::AddBinaryProperty(result,&local_74,4,"$mat.blend.transparency.alpha",0,0,aiPTI_Float);
  local_78 = source->spectra;
  aiMaterial::AddBinaryProperty
            (result,&local_78,4,"$mat.blend.transparency.specular",0,0,aiPTI_Float);
  local_7c = source->fresnel_tra;
  aiMaterial::AddBinaryProperty
            (result,&local_7c,4,"$mat.blend.transparency.fresnel",0,0,aiPTI_Float);
  local_80 = source->fresnel_tra_i;
  aiMaterial::AddBinaryProperty(result,&local_80,4,"$mat.blend.transparency.blend",0,0,aiPTI_Float);
  local_84 = source->ang;
  aiMaterial::AddBinaryProperty(result,&local_84,4,"$mat.blend.transparency.ior",0,0,aiPTI_Float);
  local_88 = source->filter;
  aiMaterial::AddBinaryProperty(result,&local_88,4,"$mat.blend.transparency.filter",0,0,aiPTI_Float)
  ;
  local_8c = source->tx_falloff;
  aiMaterial::AddBinaryProperty
            (result,&local_8c,4,"$mat.blend.transparency.falloff",0,0,aiPTI_Float);
  local_90 = source->tx_limit;
  aiMaterial::AddBinaryProperty(result,&local_90,4,"$mat.blend.transparency.limit",0,0,aiPTI_Float);
  local_94 = (int)source->ray_depth_tra;
  aiMaterial::AddBinaryProperty
            (result,&local_94,4,"$mat.blend.transparency.depth",0,0,aiPTI_Integer);
  local_98 = source->gloss_tra;
  aiMaterial::AddBinaryProperty
            (result,&local_98,4,"$mat.blend.transparency.glossAmount",0,0,aiPTI_Float);
  local_9c = source->adapt_thresh_tra;
  aiMaterial::AddBinaryProperty
            (result,&local_9c,4,"$mat.blend.transparency.glossThreshold",0,0,aiPTI_Float);
  local_a0 = (int)source->samp_gloss_tra;
  aiMaterial::AddBinaryProperty
            (result,&local_a0,4,"$mat.blend.transparency.glossSamples",0,0,aiPTI_Integer);
  local_a4 = (uint)source->mode >> 0x12 & 1;
  aiMaterial::AddBinaryProperty(result,&local_a4,4,"$mat.blend.mirror.use",0,0,aiPTI_Integer);
  local_a8 = source->ray_mirror;
  aiMaterial::AddBinaryProperty(result,&local_a8,4,"$mat.blend.mirror.reflectivity",0,0,aiPTI_Float)
  ;
  local_4c._0_4_ = source->mirr;
  local_4c._4_4_ = source->mirg;
  local_44 = source->mirb;
  aiMaterial::AddBinaryProperty(result,&local_4c,0xc,"$mat.blend.mirror.color",0,0,aiPTI_Float);
  local_ac = source->fresnel_mir;
  aiMaterial::AddBinaryProperty(result,&local_ac,4,"$mat.blend.mirror.fresnel",0,0,aiPTI_Float);
  local_b0 = source->fresnel_mir_i;
  aiMaterial::AddBinaryProperty(result,&local_b0,4,"$mat.blend.mirror.blend",0,0,aiPTI_Float);
  local_b4 = (int)source->ray_depth;
  aiMaterial::AddBinaryProperty(result,&local_b4,4,"$mat.blend.mirror.depth",0,0,aiPTI_Integer);
  local_b8 = source->dist_mir;
  aiMaterial::AddBinaryProperty(result,&local_b8,4,"$mat.blend.mirror.maxDist",0,0,aiPTI_Float);
  local_bc = (int)source->fadeto_mir;
  aiMaterial::AddBinaryProperty(result,&local_bc,4,"$mat.blend.mirror.fadeTo",0,0,aiPTI_Integer);
  local_c0 = source->gloss_mir;
  aiMaterial::AddBinaryProperty(result,&local_c0,4,"$mat.blend.mirror.glossAmount",0,0,aiPTI_Float);
  local_c4 = source->adapt_thresh_mir;
  aiMaterial::AddBinaryProperty
            (result,&local_c4,4,"$mat.blend.mirror.glossThreshold",0,0,aiPTI_Float);
  local_c8 = (int)source->samp_gloss_mir;
  aiMaterial::AddBinaryProperty
            (result,&local_c8,4,"$mat.blend.mirror.glossSamples",0,0,aiPTI_Integer);
  local_cc = source->aniso_gloss_mir;
  aiMaterial::AddBinaryProperty
            (result,&local_cc,4,"$mat.blend.mirror.glossAnisotropic",0,0,aiPTI_Float);
  return;
}

Assistant:

void BlenderImporter::AddBlendParams(aiMaterial* result, const Material* source)
{
    aiColor3D diffuseColor(source->r, source->g, source->b);
    result->AddProperty(&diffuseColor, 1, "$mat.blend.diffuse.color", 0, 0);

    float diffuseIntensity = source->ref;
    result->AddProperty(&diffuseIntensity, 1, "$mat.blend.diffuse.intensity", 0, 0);

    int diffuseShader = source->diff_shader;
    result->AddProperty(&diffuseShader, 1, "$mat.blend.diffuse.shader", 0, 0);

    int diffuseRamp = 0;
    result->AddProperty(&diffuseRamp, 1, "$mat.blend.diffuse.ramp", 0, 0);


    aiColor3D specularColor(source->specr, source->specg, source->specb);
    result->AddProperty(&specularColor, 1, "$mat.blend.specular.color", 0, 0);

    float specularIntensity = source->spec;
    result->AddProperty(&specularIntensity, 1, "$mat.blend.specular.intensity", 0, 0);

    int specularShader = source->spec_shader;
    result->AddProperty(&specularShader, 1, "$mat.blend.specular.shader", 0, 0);

    int specularRamp = 0;
    result->AddProperty(&specularRamp, 1, "$mat.blend.specular.ramp", 0, 0);

    int specularHardness = source->har;
    result->AddProperty(&specularHardness, 1, "$mat.blend.specular.hardness", 0, 0);


    int transparencyUse = source->mode & MA_TRANSPARENCY ? 1 : 0;
    result->AddProperty(&transparencyUse, 1, "$mat.blend.transparency.use", 0, 0);

    int transparencyMethod = source->mode & MA_RAYTRANSP ? 2 : (source->mode & MA_ZTRANSP ? 1 : 0);
    result->AddProperty(&transparencyMethod, 1, "$mat.blend.transparency.method", 0, 0);

    float transparencyAlpha = source->alpha;
    result->AddProperty(&transparencyAlpha, 1, "$mat.blend.transparency.alpha", 0, 0);

    float transparencySpecular = source->spectra;
    result->AddProperty(&transparencySpecular, 1, "$mat.blend.transparency.specular", 0, 0);

    float transparencyFresnel = source->fresnel_tra;
    result->AddProperty(&transparencyFresnel, 1, "$mat.blend.transparency.fresnel", 0, 0);

    float transparencyBlend = source->fresnel_tra_i;
    result->AddProperty(&transparencyBlend, 1, "$mat.blend.transparency.blend", 0, 0);

    float transparencyIor = source->ang;
    result->AddProperty(&transparencyIor, 1, "$mat.blend.transparency.ior", 0, 0);

    float transparencyFilter = source->filter;
    result->AddProperty(&transparencyFilter, 1, "$mat.blend.transparency.filter", 0, 0);

    float transparencyFalloff = source->tx_falloff;
    result->AddProperty(&transparencyFalloff, 1, "$mat.blend.transparency.falloff", 0, 0);

    float transparencyLimit = source->tx_limit;
    result->AddProperty(&transparencyLimit, 1, "$mat.blend.transparency.limit", 0, 0);

    int transparencyDepth = source->ray_depth_tra;
    result->AddProperty(&transparencyDepth, 1, "$mat.blend.transparency.depth", 0, 0);

    float transparencyGlossAmount = source->gloss_tra;
    result->AddProperty(&transparencyGlossAmount, 1, "$mat.blend.transparency.glossAmount", 0, 0);

    float transparencyGlossThreshold = source->adapt_thresh_tra;
    result->AddProperty(&transparencyGlossThreshold, 1, "$mat.blend.transparency.glossThreshold", 0, 0);

    int transparencyGlossSamples = source->samp_gloss_tra;
    result->AddProperty(&transparencyGlossSamples, 1, "$mat.blend.transparency.glossSamples", 0, 0);


    int mirrorUse = source->mode & MA_RAYMIRROR ? 1 : 0;
    result->AddProperty(&mirrorUse, 1, "$mat.blend.mirror.use", 0, 0);

    float mirrorReflectivity = source->ray_mirror;
    result->AddProperty(&mirrorReflectivity, 1, "$mat.blend.mirror.reflectivity", 0, 0);

    aiColor3D mirrorColor(source->mirr, source->mirg, source->mirb);
    result->AddProperty(&mirrorColor, 1, "$mat.blend.mirror.color", 0, 0);

    float mirrorFresnel = source->fresnel_mir;
    result->AddProperty(&mirrorFresnel, 1, "$mat.blend.mirror.fresnel", 0, 0);

    float mirrorBlend = source->fresnel_mir_i;
    result->AddProperty(&mirrorBlend, 1, "$mat.blend.mirror.blend", 0, 0);

    int mirrorDepth = source->ray_depth;
    result->AddProperty(&mirrorDepth, 1, "$mat.blend.mirror.depth", 0, 0);

    float mirrorMaxDist = source->dist_mir;
    result->AddProperty(&mirrorMaxDist, 1, "$mat.blend.mirror.maxDist", 0, 0);

    int mirrorFadeTo = source->fadeto_mir;
    result->AddProperty(&mirrorFadeTo, 1, "$mat.blend.mirror.fadeTo", 0, 0);

    float mirrorGlossAmount = source->gloss_mir;
    result->AddProperty(&mirrorGlossAmount, 1, "$mat.blend.mirror.glossAmount", 0, 0);

    float mirrorGlossThreshold = source->adapt_thresh_mir;
    result->AddProperty(&mirrorGlossThreshold, 1, "$mat.blend.mirror.glossThreshold", 0, 0);

    int mirrorGlossSamples = source->samp_gloss_mir;
    result->AddProperty(&mirrorGlossSamples, 1, "$mat.blend.mirror.glossSamples", 0, 0);

    float mirrorGlossAnisotropic = source->aniso_gloss_mir;
    result->AddProperty(&mirrorGlossAnisotropic, 1, "$mat.blend.mirror.glossAnisotropic", 0, 0);
}